

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

bool __thiscall string_view::operator==(string_view *this,string_view *other)

{
  __type_conflict1 _Var1;
  string other_str;
  string this_str;
  string_view *in_stack_ffffffffffffff98;
  string local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  operator_cast_to_string(in_stack_ffffffffffffff98);
  operator_cast_to_string(in_stack_ffffffffffffff98);
  _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return _Var1;
}

Assistant:

bool operator==(const string_view & other) const {
        std::string this_str = *this;
        std::string other_str = other;
        return this_str == other_str;
    }